

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali_variant.c
# Opt level: O1

cali_variant_t cali_variant_unpack(uchar *buf,size_t *inc,_Bool *okptr)

{
  byte bVar1;
  _Bool _Var2;
  anon_union_8_7_33918203_for_value aVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  cali_variant_t cVar8;
  
  bVar1 = 0;
  lVar4 = 0;
  uVar5 = 0;
  do {
    if (-1 < (char)buf[lVar4]) goto LAB_0019338c;
    uVar5 = uVar5 | (ulong)(buf[lVar4] & 0x7f) << (bVar1 & 0x3f);
    lVar4 = lVar4 + 1;
    bVar1 = bVar1 + 7;
  } while (lVar4 != 9);
  lVar4 = 9;
LAB_0019338c:
  uVar5 = (ulong)(buf[lVar4] & 0x7f) << ((char)lVar4 * '\a' & 0x3fU) | uVar5;
  if (((uint)uVar5 & 0xfe) < 10) {
    bVar1 = 0;
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (-1 < (char)buf[lVar7 + lVar4 + 1]) goto LAB_001933f5;
      uVar6 = uVar6 | (ulong)(buf[lVar7 + lVar4 + 1] & 0x7f) << (bVar1 & 0x3f);
      lVar7 = lVar7 + 1;
      bVar1 = bVar1 + 7;
    } while (lVar7 != 9);
    lVar7 = 9;
LAB_001933f5:
    bVar1 = buf[lVar7 + lVar4 + 1];
    if (inc != (size_t *)0x0) {
      *inc = *inc + lVar4 + lVar7 + 2;
    }
    aVar3.v_uint = (ulong)(bVar1 & 0x7f) << ((char)lVar7 * '\a' & 0x3fU) | uVar6;
    _Var2 = true;
  }
  else {
    _Var2 = false;
    aVar3.v_uint = 0;
    uVar5 = 0;
  }
  if (okptr != (_Bool *)0x0) {
    *okptr = _Var2;
  }
  cVar8.value.v_uint = aVar3.v_uint;
  cVar8.type_and_size = uVar5;
  return cVar8;
}

Assistant:

cali_variant_t cali_variant_unpack(const unsigned char* buf, size_t* inc, bool* okptr)
{
    cali_variant_t v = { 0, { .v_uint = 0 } };
    size_t         p = 0;

    uint64_t ts = vldec_u64(buf, &p);

    if (_EXTRACT_TYPE(ts) > CALI_MAXTYPE) {
        if (okptr)
            *okptr = false;

        return v;
    }

    v.type_and_size = ts;
    v.value.v_uint  = vldec_u64(buf + p, &p);

    if (inc)
        *inc += p;
    if (okptr)
        *okptr = true;

    return v;
}